

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block-utils.h
# Opt level: O3

Expression *
wasm::BlockUtils::simplifyToContents<wasm::Vacuum>(Block *block,Vacuum *parent,bool allowTypeChange)

{
  Type left;
  bool bVar1;
  Block *pBVar2;
  size_t sVar3;
  Nop *output;
  Name target;
  EffectAnalyzer local_198;
  Block *local_38;
  
  sVar3 = (block->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements;
  if (sVar3 == 1) {
    target.super_IString.str._M_str = (char *)0x1;
    target.super_IString.str._M_len = (size_t)(block->name).super_IString.str._M_str;
    bVar1 = BranchUtils::BranchSeeker::has
                      ((BranchSeeker *)
                       *(block->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                        data,(Expression *)(block->name).super_IString.str._M_len,target);
    sVar3 = (block->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
            .usedElements;
    if (!bVar1) {
      if (sVar3 == 0) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      local_38 = (Block *)*(block->list).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           .data;
      EffectAnalyzer::EffectAnalyzer
                (&local_198,
                 &((parent->
                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                   ).super_Pass.runner)->options,
                 (parent->
                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                 ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                 super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                 super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule,
                 (Expression *)local_38);
      bVar1 = true;
      if (local_198.trap == false) {
        bVar1 = EffectAnalyzer::hasNonTrapSideEffects(&local_198);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)((long)&local_198 + 0x130));
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)((long)&local_198 + 0x100));
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)((long)&local_198 + 0xa8));
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)((long)&local_198 + 0x78));
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)((long)&local_198 + 0x48));
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)((long)&local_198 + 0x18));
      pBVar2 = local_38;
      left.id = (local_38->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.
                id;
      if ((bVar1 == false) && (left.id < 2)) {
        local_198._0_8_ =
             (parent->
             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
             ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
             super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
             super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule;
        pBVar2 = (Block *)Builder::replaceWithIdenticalType<wasm::Block>
                                    ((Builder *)&local_198,block);
        return (Expression *)pBVar2;
      }
      bVar1 = wasm::Type::isSubType
                        (left,(Type)(block->super_SpecificExpression<(wasm::Expression::Id)1>).
                                    super_Expression.type.id);
      if (bVar1 || allowTypeChange) {
        return (Expression *)pBVar2;
      }
      if ((1 < (block->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id)
         && ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id ==
             1)) {
        return (Expression *)block;
      }
      __assert_fail("block->type.isConcrete() && singleton->type == Type::unreachable",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/block-utils.h"
                    ,0x36,
                    "Expression *wasm::BlockUtils::simplifyToContents(Block *, T *, bool) [T = wasm::Vacuum]"
                   );
    }
  }
  if (sVar3 == 0) {
    (block->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = NopId;
    (block->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
  }
  return (Expression *)block;
}

Assistant:

inline Expression*
simplifyToContents(Block* block, T* parent, bool allowTypeChange = false) {
  auto& list = block->list;
  if (list.size() == 1 &&
      !BranchUtils::BranchSeeker::has(list[0], block->name)) {
    // just one element. try to replace the block
    auto* singleton = list[0];
    auto sideEffects =
      EffectAnalyzer(parent->getPassOptions(), *parent->getModule(), singleton)
        .hasSideEffects();
    if (!sideEffects && !singleton->type.isConcrete()) {
      // no side effects, and singleton is not returning a value, so we can
      // throw away the block and its contents, basically
      return Builder(*parent->getModule()).replaceWithIdenticalType(block);
    } else if (Type::isSubType(singleton->type, block->type) ||
               allowTypeChange) {
      return singleton;
    } else {
      // (side effects +) type change, must be block with declared value but
      // inside is unreachable (if both concrete, must match, and since no name
      // on block, we can't be branched to, so if singleton is unreachable, so
      // is the block)
      assert(block->type.isConcrete() && singleton->type == Type::unreachable);
      // we could replace with unreachable, but would need to update all
      // the parent's types
    }
  } else if (list.size() == 0) {
    ExpressionManipulator::nop(block);
  }
  return block;
}